

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

MetadataResult RunShellCommand(ShellState *state,char **azArg,idx_t nArg)

{
  uint uVar1;
  char *pcVar2;
  ulong in_RDX;
  long in_RSI;
  char *pcVar3;
  idx_t i;
  int x;
  char *zCmd;
  ulong local_38;
  char *local_28;
  MetadataResult local_1;
  
  if (safe_mode) {
    fprintf(_stderr,".sh/.system cannot be used in -safe mode\n");
    local_1 = FAIL;
  }
  else if (in_RDX < 2) {
    local_1 = PRINT_USAGE;
  }
  else {
    pcVar2 = strchr(*(char **)(in_RSI + 8),0x20);
    pcVar3 = "\"%s\"";
    if (pcVar2 == (char *)0x0) {
      pcVar3 = "%s";
    }
    local_28 = duckdb_shell_sqlite3_mprintf(pcVar3,*(undefined8 *)(in_RSI + 8));
    for (local_38 = 2; local_38 < in_RDX; local_38 = local_38 + 1) {
      pcVar2 = strchr(*(char **)(in_RSI + local_38 * 8),0x20);
      pcVar3 = "%z \"%s\"";
      if (pcVar2 == (char *)0x0) {
        pcVar3 = "%z %s";
      }
      local_28 = duckdb_shell_sqlite3_mprintf
                           (pcVar3,local_28,*(undefined8 *)(in_RSI + local_38 * 8));
    }
    uVar1 = system(local_28);
    duckdb_shell_sqlite3_free((void *)0x1e1578);
    if (uVar1 != 0) {
      fprintf(_stderr,"System command returns %d\n",(ulong)uVar1);
    }
    local_1 = SUCCESS;
  }
  return local_1;
}

Assistant:

MetadataResult RunShellCommand(ShellState &state, const char **azArg, idx_t nArg) {
	if (safe_mode) {
		utf8_printf(stderr, ".sh/.system cannot be used in -safe mode\n");
		return MetadataResult::FAIL;
	}
	char *zCmd;
	int x;
	if (nArg < 2) {
		return MetadataResult::PRINT_USAGE;
	}
	zCmd = sqlite3_mprintf(strchr(azArg[1], ' ') == 0 ? "%s" : "\"%s\"", azArg[1]);
	for (idx_t i = 2; i < nArg; i++) {
		zCmd = sqlite3_mprintf(strchr(azArg[i], ' ') == 0 ? "%z %s" : "%z \"%s\"", zCmd, azArg[i]);
	}
	x = system(zCmd);
	sqlite3_free(zCmd);
	if (x) {
		raw_printf(stderr, "System command returns %d\n", x);
	}
	return MetadataResult::SUCCESS;
}